

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O0

void PaUtil_DestroyAllocationGroup(PaUtilAllocationGroup *group)

{
  PaUtilAllocationGroupLink *pPVar1;
  PaUtilAllocationGroupLink *next;
  PaUtilAllocationGroupLink *current;
  PaUtilAllocationGroup *group_local;
  
  next = group->linkBlocks;
  while (next != (PaUtilAllocationGroupLink *)0x0) {
    pPVar1 = next->next;
    PaUtil_FreeMemory(next->buffer);
    next = pPVar1;
  }
  PaUtil_FreeMemory(group);
  return;
}

Assistant:

void PaUtil_DestroyAllocationGroup( PaUtilAllocationGroup* group )
{
    struct PaUtilAllocationGroupLink *current = group->linkBlocks;
    struct PaUtilAllocationGroupLink *next;

    while( current )
    {
        next = current->next;
        PaUtil_FreeMemory( current->buffer );
        current = next;
    }

    PaUtil_FreeMemory( group );
}